

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O1

qint64 __thiscall
QHttpNetworkReplyPrivate::readBody
          (QHttpNetworkReplyPrivate *this,QIODevice *socket,QByteDataBuffer *out)

{
  long lVar1;
  qint64 size;
  
  if (this->chunkedTransferEncoding == true) {
    lVar1 = readReplyBodyChunked(this,socket,out);
  }
  else if (this->bodyLength < 1) {
    size = (**(code **)(*(long *)socket + 0xa0))(socket);
    lVar1 = readReplyBodyRaw(this,socket,out,size);
  }
  else {
    lVar1 = readReplyBodyRaw(this,socket,out,this->bodyLength - this->contentRead);
    if (lVar1 + this->contentRead == this->bodyLength) {
      this->state = AllDoneState;
    }
  }
  this->contentRead = this->contentRead + lVar1;
  return lVar1;
}

Assistant:

qint64 QHttpNetworkReplyPrivate::readBody(QIODevice *socket, QByteDataBuffer *out)
{
    qint64 bytes = 0;

    if (isChunked()) {
        // chunked transfer encoding (rfc 2616, sec 3.6)
        bytes += readReplyBodyChunked(socket, out);
    } else if (bodyLength > 0) {
        // we have a Content-Length
        bytes += readReplyBodyRaw(socket, out, bodyLength - contentRead);
        if (contentRead + bytes == bodyLength)
            state = AllDoneState;
    } else {
        // no content length. just read what's possible
        bytes += readReplyBodyRaw(socket, out, socket->bytesAvailable());
    }
    contentRead += bytes;
    return bytes;
}